

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O1

FT_Error open_face_from_buffer
                   (FT_Library library,FT_Byte *base,FT_ULong size,FT_Long face_index,
                   char *driver_name,FT_Face_conflict *aface)

{
  FT_Memory pFVar1;
  FT_Stream pFVar2;
  FT_Error FVar3;
  FT_Open_Args args;
  FT_Open_Args local_70;
  
  pFVar1 = library->memory;
  if (base == (FT_Byte *)0x0) {
    FVar3 = 6;
    pFVar2 = (FT_Stream)0x0;
  }
  else {
    pFVar2 = (FT_Stream)(*pFVar1->alloc)(pFVar1,0x50);
    FVar3 = (uint)(pFVar2 == (FT_Stream)0x0) << 6;
    if (pFVar2 == (FT_Stream)0x0) {
      pFVar2 = (FT_Stream)0x0;
    }
    else {
      pFVar2->base = (uchar *)0x0;
      pFVar2->size = 0;
      pFVar2->pos = 0;
      (pFVar2->descriptor).value = 0;
      pFVar2->cursor = (uchar *)0x0;
      pFVar2->limit = (uchar *)0x0;
      pFVar2->close = (FT_Stream_CloseFunc)0x0;
      pFVar2->memory = (FT_Memory)0x0;
      (pFVar2->pathname).value = 0;
      pFVar2->read = (FT_Stream_IoFunc)0x0;
      pFVar2->base = base;
      pFVar2->size = size;
      pFVar2->pos = 0;
      pFVar2->cursor = (uchar *)0x0;
      pFVar2->read = (FT_Stream_IoFunc)0x0;
      pFVar2->close = (FT_Stream_CloseFunc)0x0;
      pFVar2->close = memory_stream_close;
    }
  }
  if (FVar3 == 0) {
    local_70.flags = 2;
    local_70.stream = pFVar2;
    if (driver_name != (char *)0x0) {
      local_70.flags = 10;
      local_70.driver = FT_Get_Module(library,driver_name);
    }
    FVar3 = ft_open_face_internal(library,&local_70,face_index,aface,'\0');
    if (FVar3 == 0) {
      (*aface)->face_flags = (*aface)->face_flags & 0xfffffffffffffbff;
      return 0;
    }
    if (pFVar2 == (FT_Stream)0x0) {
      return FVar3;
    }
    if (pFVar2->close != (FT_Stream_CloseFunc)0x0) {
      (*pFVar2->close)(pFVar2);
    }
    base = (FT_Byte *)pFVar2;
    if (pFVar2 == (FT_Stream)0x0) {
      return FVar3;
    }
  }
  else if (base == (FT_Byte *)0x0) {
    return FVar3;
  }
  (*pFVar1->free)(pFVar1,base);
  return FVar3;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  open_face_from_buffer( FT_Library   library,
                         FT_Byte*     base,
                         FT_ULong     size,
                         FT_Long      face_index,
                         const char*  driver_name,
                         FT_Face     *aface )
  {
    FT_Open_Args  args;
    FT_Error      error;
    FT_Stream     stream = NULL;
    FT_Memory     memory = library->memory;


    error = new_memory_stream( library,
                               base,
                               size,
                               memory_stream_close,
                               &stream );
    if ( error )
    {
      FT_FREE( base );
      return error;
    }

    args.flags  = FT_OPEN_STREAM;
    args.stream = stream;
    if ( driver_name )
    {
      args.flags  = args.flags | FT_OPEN_DRIVER;
      args.driver = FT_Get_Module( library, driver_name );
    }

#ifdef FT_MACINTOSH
    /* At this point, the face index has served its purpose;  */
    /* whoever calls this function has already used it to     */
    /* locate the correct font data.  We should not propagate */
    /* this index to FT_Open_Face() (unless it is negative).  */

    if ( face_index > 0 )
      face_index &= 0x7FFF0000L; /* retain GX data */
#endif

    error = ft_open_face_internal( library, &args, face_index, aface, 0 );

    if ( !error )
      (*aface)->face_flags &= ~FT_FACE_FLAG_EXTERNAL_STREAM;
    else
#ifdef FT_MACINTOSH
      FT_Stream_Free( stream, 0 );
#else
    {
      FT_Stream_Close( stream );
      FT_FREE( stream );
    }
#endif

    return error;
  }